

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

char * __thiscall
kj::_::NullableValue<signed_char>::emplace<long_long>
          (NullableValue<signed_char> *this,longlong *params)

{
  longlong *params_00;
  longlong *params_local;
  NullableValue<signed_char> *this_local;
  
  if ((this->isSet & 1U) != 0) {
    this->isSet = false;
    dtor<signed_char>(&(this->field_1).value);
  }
  params_00 = fwd<long_long>(params);
  ctor<signed_char,long_long>(&(this->field_1).value,params_00);
  this->isSet = true;
  return (char *)&this->field_1;
}

Assistant:

inline T& emplace(Params&&... params) {
    if (isSet) {
      isSet = false;
      dtor(value);
    }
    ctor(value, kj::fwd<Params>(params)...);
    isSet = true;
    return value;
  }